

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk90(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  uint offs;
  int iVar3;
  int iVar4;
  int iVar5;
  envy_bios_power_unk90_entry *peVar6;
  ulong uVar7;
  
  offs = (bios->power).unk90.offset;
  iVar3 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk90.version);
    uVar1 = (bios->power).unk90.version;
    if ((uVar1 == ' ') || (uVar1 == '\x10')) {
      iVar3 = bios_u8(bios,(bios->power).unk90.offset + 1,&(bios->power).unk90.hlen);
      iVar4 = bios_u8(bios,(bios->power).unk90.offset + 2,&(bios->power).unk90.rlen);
      iVar5 = bios_u8(bios,(bios->power).unk90.offset + 3,&(bios->power).unk90.entriesnum);
      (bios->power).unk90.valid = iVar5 == 0 && (iVar4 == 0 && iVar3 == 0);
      bVar2 = (bios->power).unk90.entriesnum;
      peVar6 = (envy_bios_power_unk90_entry *)malloc((ulong)bVar2 << 2);
      (bios->power).unk90.entries = peVar6;
      iVar3 = 0;
      for (uVar7 = 0; bVar2 != uVar7; uVar7 = uVar7 + 1) {
        peVar6[uVar7].offset =
             (uint)(bios->power).unk90.rlen * (int)uVar7 +
             (uint)(bios->power).unk90.hlen + (bios->power).unk90.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER PSI table version 0x%x\n");
    }
  }
  return iVar3;
}

Assistant:

int envy_bios_parse_power_unk90(struct envy_bios *bios) {
	struct envy_bios_power_unk90 *unk90 = &bios->power.unk90;
	int i, err = 0;

	if (!unk90->offset)
		return -EINVAL;

	bios_u8(bios, unk90->offset + 0x0, &unk90->version);
	switch(unk90->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, unk90->offset + 0x1, &unk90->hlen);
		err |= bios_u8(bios, unk90->offset + 0x2, &unk90->rlen);
		err |= bios_u8(bios, unk90->offset + 0x3, &unk90->entriesnum);
		unk90->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER PSI table version 0x%x\n", unk90->version);
		return -EINVAL;
	};

	err = 0;
	unk90->entries = malloc(unk90->entriesnum * sizeof(struct envy_bios_power_unk90_entry));
	for (i = 0; i < unk90->entriesnum; i++) {
		uint32_t data = unk90->offset + unk90->hlen + i * unk90->rlen;

		unk90->entries[i].offset = data;
	}

	return 0;
}